

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase161::run(TestCase161 *this)

{
  char32_t *pcVar1;
  bool errors;
  bool errors_00;
  bool errors_01;
  bool errors_02;
  bool errors_03;
  bool errors_04;
  char *pcVar2;
  undefined1 in_R8B;
  size_t sVar3;
  EncodingResult<kj::Array<char32_t>_> local_358;
  EncodingResult<kj::Array<char32_t>_> local_338;
  EncodingResult<kj::Array<char32_t>_> local_318;
  EncodingResult<kj::Array<char32_t>_> local_2f8;
  EncodingResult<kj::Array<char32_t>_> local_2d8;
  EncodingResult<kj::Array<char32_t>_> local_2b8;
  EncodingResult<kj::Array<char32_t>_> local_298;
  EncodingResult<kj::Array<char32_t>_> local_278;
  EncodingResult<kj::Array<char32_t>_> local_258;
  EncodingResult<kj::Array<char32_t>_> local_238;
  EncodingResult<kj::Array<char32_t>_> local_218;
  EncodingResult<kj::Array<char32_t>_> local_1f8;
  EncodingResult<kj::Array<char32_t>_> local_1d8;
  EncodingResult<kj::Array<char32_t>_> local_1b8;
  EncodingResult<kj::Array<char32_t>_> local_198;
  EncodingResult<kj::Array<char32_t>_> local_178;
  EncodingResult<kj::Array<char32_t>_> local_158;
  EncodingResult<kj::Array<char32_t>_> local_138;
  EncodingResult<kj::Array<char32_t>_> local_118;
  EncodingResult<kj::Array<char32_t>_> local_f8;
  EncodingResult<kj::Array<char32_t>_> local_d8;
  EncodingResult<kj::Array<char32_t>_> local_b8;
  EncodingResult<kj::Array<char32_t>_> local_98;
  EncodingResult<kj::Array<char32_t>_> local_78;
  EncodingResult<kj::Array<char32_t>_> local_58;
  EncodingResult<kj::Array<char32_t>_> local_38;
  
  encodeUtf32(&local_38,(kj *)(anon_var_dwarf_3b0318 + 7),(ArrayPtr<const_char>)ZEXT816(1),
              (bool)in_R8B);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,2ul>
            (&local_38,&anon_var_dwarf_3b0458,true);
  sVar3 = local_38.super_Array<char32_t>.size_;
  pcVar1 = local_38.super_Array<char32_t>.ptr;
  if (local_38.super_Array<char32_t>.ptr != (char32_t *)0x0) {
    local_38.super_Array<char32_t>.ptr = (char32_t *)0x0;
    local_38.super_Array<char32_t>.size_ = 0;
    (**(local_38.super_Array<char32_t>.disposer)->_vptr_ArrayDisposer)
              (local_38.super_Array<char32_t>.disposer,pcVar1,4,sVar3,sVar3,0);
    in_R8B = (undefined1)sVar3;
  }
  encodeUtf32(&local_58,(kj *)anon_var_dwarf_3b015c,(ArrayPtr<const_char>)ZEXT816(3),(bool)in_R8B);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,4ul>
            (&local_58,&anon_var_dwarf_3b0471,true);
  sVar3 = local_58.super_Array<char32_t>.size_;
  pcVar1 = local_58.super_Array<char32_t>.ptr;
  if (local_58.super_Array<char32_t>.ptr != (char32_t *)0x0) {
    local_58.super_Array<char32_t>.ptr = (char32_t *)0x0;
    local_58.super_Array<char32_t>.size_ = 0;
    (**(local_58.super_Array<char32_t>.disposer)->_vptr_ArrayDisposer)
              (local_58.super_Array<char32_t>.disposer,pcVar1,4,sVar3,sVar3,0);
    in_R8B = (undefined1)sVar3;
  }
  encodeUtf32(&local_78,(kj *)anon_var_dwarf_3b0180,(ArrayPtr<const_char>)ZEXT816(5),(bool)in_R8B);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,4ul>
            (&local_78,&anon_var_dwarf_3b0471,true);
  sVar3 = local_78.super_Array<char32_t>.size_;
  pcVar1 = local_78.super_Array<char32_t>.ptr;
  if (local_78.super_Array<char32_t>.ptr != (char32_t *)0x0) {
    local_78.super_Array<char32_t>.ptr = (char32_t *)0x0;
    local_78.super_Array<char32_t>.size_ = 0;
    (**(local_78.super_Array<char32_t>.disposer)->_vptr_ArrayDisposer)
              (local_78.super_Array<char32_t>.disposer,pcVar1,4,sVar3,sVar3,0);
    in_R8B = (undefined1)sVar3;
  }
  pcVar2 = anon_var_dwarf_3b018b;
  encodeUtf32(&local_98,(kj *)anon_var_dwarf_3b018b,(ArrayPtr<const_char>)ZEXT816(2),(bool)in_R8B);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,3ul>
            (&local_98,(char32_t (*) [3])pcVar2,errors);
  sVar3 = local_98.super_Array<char32_t>.size_;
  pcVar1 = local_98.super_Array<char32_t>.ptr;
  if (local_98.super_Array<char32_t>.ptr != (char32_t *)0x0) {
    local_98.super_Array<char32_t>.ptr = (char32_t *)0x0;
    local_98.super_Array<char32_t>.size_ = 0;
    (**(local_98.super_Array<char32_t>.disposer)->_vptr_ArrayDisposer)
              (local_98.super_Array<char32_t>.disposer,pcVar1,4,sVar3,sVar3,0);
    in_R8B = (undefined1)sVar3;
  }
  pcVar2 = anon_var_dwarf_3b01bd;
  encodeUtf32(&local_b8,(kj *)anon_var_dwarf_3b01bd,(ArrayPtr<const_char>)ZEXT816(2),(bool)in_R8B);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,3ul>
            (&local_b8,(char32_t (*) [3])pcVar2,errors_00);
  sVar3 = local_b8.super_Array<char32_t>.size_;
  pcVar1 = local_b8.super_Array<char32_t>.ptr;
  if (local_b8.super_Array<char32_t>.ptr != (char32_t *)0x0) {
    local_b8.super_Array<char32_t>.ptr = (char32_t *)0x0;
    local_b8.super_Array<char32_t>.size_ = 0;
    (**(local_b8.super_Array<char32_t>.disposer)->_vptr_ArrayDisposer)
              (local_b8.super_Array<char32_t>.disposer,pcVar1,4,sVar3,sVar3,0);
    in_R8B = (undefined1)sVar3;
  }
  pcVar2 = anon_var_dwarf_3b01c8;
  encodeUtf32(&local_d8,(kj *)anon_var_dwarf_3b01c8,(ArrayPtr<const_char>)ZEXT816(3),(bool)in_R8B);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,3ul>
            (&local_d8,(char32_t (*) [3])pcVar2,errors_01);
  sVar3 = local_d8.super_Array<char32_t>.size_;
  pcVar1 = local_d8.super_Array<char32_t>.ptr;
  if (local_d8.super_Array<char32_t>.ptr != (char32_t *)0x0) {
    local_d8.super_Array<char32_t>.ptr = (char32_t *)0x0;
    local_d8.super_Array<char32_t>.size_ = 0;
    (**(local_d8.super_Array<char32_t>.disposer)->_vptr_ArrayDisposer)
              (local_d8.super_Array<char32_t>.disposer,pcVar1,4,sVar3,sVar3,0);
    in_R8B = (undefined1)sVar3;
  }
  pcVar2 = anon_var_dwarf_3b01d3;
  encodeUtf32(&local_f8,(kj *)anon_var_dwarf_3b01d3,(ArrayPtr<const_char>)ZEXT816(2),(bool)in_R8B);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,3ul>
            (&local_f8,(char32_t (*) [3])pcVar2,errors_02);
  sVar3 = local_f8.super_Array<char32_t>.size_;
  pcVar1 = local_f8.super_Array<char32_t>.ptr;
  if (local_f8.super_Array<char32_t>.ptr != (char32_t *)0x0) {
    local_f8.super_Array<char32_t>.ptr = (char32_t *)0x0;
    local_f8.super_Array<char32_t>.size_ = 0;
    (**(local_f8.super_Array<char32_t>.disposer)->_vptr_ArrayDisposer)
              (local_f8.super_Array<char32_t>.disposer,pcVar1,4,sVar3,sVar3,0);
    in_R8B = (undefined1)sVar3;
  }
  pcVar2 = anon_var_dwarf_3b01de;
  encodeUtf32(&local_118,(kj *)anon_var_dwarf_3b01de,(ArrayPtr<const_char>)ZEXT816(3),(bool)in_R8B);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,3ul>
            (&local_118,(char32_t (*) [3])pcVar2,errors_03);
  sVar3 = local_118.super_Array<char32_t>.size_;
  pcVar1 = local_118.super_Array<char32_t>.ptr;
  if (local_118.super_Array<char32_t>.ptr != (char32_t *)0x0) {
    local_118.super_Array<char32_t>.ptr = (char32_t *)0x0;
    local_118.super_Array<char32_t>.size_ = 0;
    (**(local_118.super_Array<char32_t>.disposer)->_vptr_ArrayDisposer)
              (local_118.super_Array<char32_t>.disposer,pcVar1,4,sVar3,sVar3,0);
    in_R8B = (undefined1)sVar3;
  }
  pcVar2 = anon_var_dwarf_3b01e9;
  encodeUtf32(&local_138,(kj *)anon_var_dwarf_3b01e9,(ArrayPtr<const_char>)ZEXT816(4),(bool)in_R8B);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,3ul>
            (&local_138,(char32_t (*) [3])pcVar2,errors_04);
  sVar3 = local_138.super_Array<char32_t>.size_;
  pcVar1 = local_138.super_Array<char32_t>.ptr;
  if (local_138.super_Array<char32_t>.ptr != (char32_t *)0x0) {
    local_138.super_Array<char32_t>.ptr = (char32_t *)0x0;
    local_138.super_Array<char32_t>.size_ = 0;
    (**(local_138.super_Array<char32_t>.disposer)->_vptr_ArrayDisposer)
              (local_138.super_Array<char32_t>.disposer,pcVar1,4,sVar3,sVar3,0);
    in_R8B = (undefined1)sVar3;
  }
  encodeUtf32(&local_158,(kj *)anon_var_dwarf_3b01f4,(ArrayPtr<const_char>)ZEXT816(2),(bool)in_R8B);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,2ul>
            (&local_158,&anon_var_dwarf_3b0458,true);
  sVar3 = local_158.super_Array<char32_t>.size_;
  pcVar1 = local_158.super_Array<char32_t>.ptr;
  if (local_158.super_Array<char32_t>.ptr != (char32_t *)0x0) {
    local_158.super_Array<char32_t>.ptr = (char32_t *)0x0;
    local_158.super_Array<char32_t>.size_ = 0;
    (**(local_158.super_Array<char32_t>.disposer)->_vptr_ArrayDisposer)
              (local_158.super_Array<char32_t>.disposer,pcVar1,4,sVar3,sVar3,0);
    in_R8B = (undefined1)sVar3;
  }
  encodeUtf32(&local_178,(kj *)anon_var_dwarf_3b01ff,(ArrayPtr<const_char>)ZEXT816(2),(bool)in_R8B);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,2ul>
            (&local_178,&anon_var_dwarf_3b0458,true);
  sVar3 = local_178.super_Array<char32_t>.size_;
  pcVar1 = local_178.super_Array<char32_t>.ptr;
  if (local_178.super_Array<char32_t>.ptr != (char32_t *)0x0) {
    local_178.super_Array<char32_t>.ptr = (char32_t *)0x0;
    local_178.super_Array<char32_t>.size_ = 0;
    (**(local_178.super_Array<char32_t>.disposer)->_vptr_ArrayDisposer)
              (local_178.super_Array<char32_t>.disposer,pcVar1,4,sVar3,sVar3,0);
    in_R8B = (undefined1)sVar3;
  }
  encodeUtf32(&local_198,(kj *)anon_var_dwarf_3b020a,(ArrayPtr<const_char>)ZEXT816(2),(bool)in_R8B);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,2ul>
            (&local_198,(char32_t (*) [2])L"\x80",false);
  sVar3 = local_198.super_Array<char32_t>.size_;
  pcVar1 = local_198.super_Array<char32_t>.ptr;
  if (local_198.super_Array<char32_t>.ptr != (char32_t *)0x0) {
    local_198.super_Array<char32_t>.ptr = (char32_t *)0x0;
    local_198.super_Array<char32_t>.size_ = 0;
    (**(local_198.super_Array<char32_t>.disposer)->_vptr_ArrayDisposer)
              (local_198.super_Array<char32_t>.disposer,pcVar1,4,sVar3,sVar3,0);
    in_R8B = (undefined1)sVar3;
  }
  encodeUtf32(&local_1b8,(kj *)anon_var_dwarf_3b0220,(ArrayPtr<const_char>)ZEXT816(2),(bool)in_R8B);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,2ul>
            (&local_1b8,(char32_t (*) [2])L"߿",false);
  sVar3 = local_1b8.super_Array<char32_t>.size_;
  pcVar1 = local_1b8.super_Array<char32_t>.ptr;
  if (local_1b8.super_Array<char32_t>.ptr != (char32_t *)0x0) {
    local_1b8.super_Array<char32_t>.ptr = (char32_t *)0x0;
    local_1b8.super_Array<char32_t>.size_ = 0;
    (**(local_1b8.super_Array<char32_t>.disposer)->_vptr_ArrayDisposer)
              (local_1b8.super_Array<char32_t>.disposer,pcVar1,4,sVar3,sVar3,0);
    in_R8B = (undefined1)sVar3;
  }
  encodeUtf32(&local_1d8,(kj *)anon_var_dwarf_3b0236,(ArrayPtr<const_char>)ZEXT816(3),(bool)in_R8B);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,2ul>
            (&local_1d8,&anon_var_dwarf_3b0458,true);
  sVar3 = local_1d8.super_Array<char32_t>.size_;
  pcVar1 = local_1d8.super_Array<char32_t>.ptr;
  if (local_1d8.super_Array<char32_t>.ptr != (char32_t *)0x0) {
    local_1d8.super_Array<char32_t>.ptr = (char32_t *)0x0;
    local_1d8.super_Array<char32_t>.size_ = 0;
    (**(local_1d8.super_Array<char32_t>.disposer)->_vptr_ArrayDisposer)
              (local_1d8.super_Array<char32_t>.disposer,pcVar1,4,sVar3,sVar3,0);
    in_R8B = (undefined1)sVar3;
  }
  encodeUtf32(&local_1f8,(kj *)anon_var_dwarf_3b0241,(ArrayPtr<const_char>)ZEXT816(3),(bool)in_R8B);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,2ul>
            (&local_1f8,&anon_var_dwarf_3b0458,true);
  sVar3 = local_1f8.super_Array<char32_t>.size_;
  pcVar1 = local_1f8.super_Array<char32_t>.ptr;
  if (local_1f8.super_Array<char32_t>.ptr != (char32_t *)0x0) {
    local_1f8.super_Array<char32_t>.ptr = (char32_t *)0x0;
    local_1f8.super_Array<char32_t>.size_ = 0;
    (**(local_1f8.super_Array<char32_t>.disposer)->_vptr_ArrayDisposer)
              (local_1f8.super_Array<char32_t>.disposer,pcVar1,4,sVar3,sVar3,0);
    in_R8B = (undefined1)sVar3;
  }
  encodeUtf32(&local_218,(kj *)anon_var_dwarf_3b024c,(ArrayPtr<const_char>)ZEXT816(3),(bool)in_R8B);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,2ul>
            (&local_218,(char32_t (*) [2])L"ࠀ",false);
  sVar3 = local_218.super_Array<char32_t>.size_;
  pcVar1 = local_218.super_Array<char32_t>.ptr;
  if (local_218.super_Array<char32_t>.ptr != (char32_t *)0x0) {
    local_218.super_Array<char32_t>.ptr = (char32_t *)0x0;
    local_218.super_Array<char32_t>.size_ = 0;
    (**(local_218.super_Array<char32_t>.disposer)->_vptr_ArrayDisposer)
              (local_218.super_Array<char32_t>.disposer,pcVar1,4,sVar3,sVar3,0);
    in_R8B = (undefined1)sVar3;
  }
  encodeUtf32(&local_238,(kj *)anon_var_dwarf_3b0278,(ArrayPtr<const_char>)ZEXT816(3),(bool)in_R8B);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,2ul>
            (&local_238,(char32_t (*) [2])L"\xffff",false);
  sVar3 = local_238.super_Array<char32_t>.size_;
  pcVar1 = local_238.super_Array<char32_t>.ptr;
  if (local_238.super_Array<char32_t>.ptr != (char32_t *)0x0) {
    local_238.super_Array<char32_t>.ptr = (char32_t *)0x0;
    local_238.super_Array<char32_t>.size_ = 0;
    (**(local_238.super_Array<char32_t>.disposer)->_vptr_ArrayDisposer)
              (local_238.super_Array<char32_t>.disposer,pcVar1,4,sVar3,sVar3,0);
    in_R8B = (undefined1)sVar3;
  }
  encodeUtf32(&local_258,(kj *)anon_var_dwarf_3b028e,(ArrayPtr<const_char>)ZEXT816(4),(bool)in_R8B);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,2ul>
            (&local_258,&anon_var_dwarf_3b0458,true);
  sVar3 = local_258.super_Array<char32_t>.size_;
  pcVar1 = local_258.super_Array<char32_t>.ptr;
  if (local_258.super_Array<char32_t>.ptr != (char32_t *)0x0) {
    local_258.super_Array<char32_t>.ptr = (char32_t *)0x0;
    local_258.super_Array<char32_t>.size_ = 0;
    (**(local_258.super_Array<char32_t>.disposer)->_vptr_ArrayDisposer)
              (local_258.super_Array<char32_t>.disposer,pcVar1,4,sVar3,sVar3,0);
    in_R8B = (undefined1)sVar3;
  }
  encodeUtf32(&local_278,(kj *)anon_var_dwarf_3b0299,(ArrayPtr<const_char>)ZEXT816(4),(bool)in_R8B);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,2ul>
            (&local_278,&anon_var_dwarf_3b0458,true);
  sVar3 = local_278.super_Array<char32_t>.size_;
  pcVar1 = local_278.super_Array<char32_t>.ptr;
  if (local_278.super_Array<char32_t>.ptr != (char32_t *)0x0) {
    local_278.super_Array<char32_t>.ptr = (char32_t *)0x0;
    local_278.super_Array<char32_t>.size_ = 0;
    (**(local_278.super_Array<char32_t>.disposer)->_vptr_ArrayDisposer)
              (local_278.super_Array<char32_t>.disposer,pcVar1,4,sVar3,sVar3,0);
    in_R8B = (undefined1)sVar3;
  }
  encodeUtf32(&local_298,(kj *)anon_var_dwarf_3b02a4,(ArrayPtr<const_char>)ZEXT816(4),(bool)in_R8B);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,2ul>
            (&local_298,(char32_t (*) [2])L"𐀀",false);
  sVar3 = local_298.super_Array<char32_t>.size_;
  pcVar1 = local_298.super_Array<char32_t>.ptr;
  if (local_298.super_Array<char32_t>.ptr != (char32_t *)0x0) {
    local_298.super_Array<char32_t>.ptr = (char32_t *)0x0;
    local_298.super_Array<char32_t>.size_ = 0;
    (**(local_298.super_Array<char32_t>.disposer)->_vptr_ArrayDisposer)
              (local_298.super_Array<char32_t>.disposer,pcVar1,4,sVar3,sVar3,0);
    in_R8B = (undefined1)sVar3;
  }
  encodeUtf32(&local_2b8,(kj *)anon_var_dwarf_3b02ba,(ArrayPtr<const_char>)ZEXT816(4),(bool)in_R8B);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,2ul>
            (&local_2b8,(char32_t (*) [2])L"\x0010ffff",false);
  sVar3 = local_2b8.super_Array<char32_t>.size_;
  pcVar1 = local_2b8.super_Array<char32_t>.ptr;
  if (local_2b8.super_Array<char32_t>.ptr != (char32_t *)0x0) {
    local_2b8.super_Array<char32_t>.ptr = (char32_t *)0x0;
    local_2b8.super_Array<char32_t>.size_ = 0;
    (**(local_2b8.super_Array<char32_t>.disposer)->_vptr_ArrayDisposer)
              (local_2b8.super_Array<char32_t>.disposer,pcVar1,4,sVar3,sVar3,0);
    in_R8B = (undefined1)sVar3;
  }
  encodeUtf32(&local_2d8,(kj *)anon_var_dwarf_3b02d0,(ArrayPtr<const_char>)ZEXT816(4),(bool)in_R8B);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,2ul>
            (&local_2d8,&anon_var_dwarf_3b0458,true);
  sVar3 = local_2d8.super_Array<char32_t>.size_;
  pcVar1 = local_2d8.super_Array<char32_t>.ptr;
  if (local_2d8.super_Array<char32_t>.ptr != (char32_t *)0x0) {
    local_2d8.super_Array<char32_t>.ptr = (char32_t *)0x0;
    local_2d8.super_Array<char32_t>.size_ = 0;
    (**(local_2d8.super_Array<char32_t>.disposer)->_vptr_ArrayDisposer)
              (local_2d8.super_Array<char32_t>.disposer,pcVar1,4,sVar3,sVar3,0);
    in_R8B = (undefined1)sVar3;
  }
  encodeUtf32(&local_2f8,(kj *)anon_var_dwarf_3b02db,(ArrayPtr<const_char>)ZEXT816(5),(bool)in_R8B);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,2ul>
            (&local_2f8,&anon_var_dwarf_3b0458,true);
  sVar3 = local_2f8.super_Array<char32_t>.size_;
  pcVar1 = local_2f8.super_Array<char32_t>.ptr;
  if (local_2f8.super_Array<char32_t>.ptr != (char32_t *)0x0) {
    local_2f8.super_Array<char32_t>.ptr = (char32_t *)0x0;
    local_2f8.super_Array<char32_t>.size_ = 0;
    (**(local_2f8.super_Array<char32_t>.disposer)->_vptr_ArrayDisposer)
              (local_2f8.super_Array<char32_t>.disposer,pcVar1,4,sVar3,sVar3,0);
    in_R8B = (undefined1)sVar3;
  }
  encodeUtf32(&local_318,(kj *)anon_var_dwarf_3b02e6,(ArrayPtr<const_char>)ZEXT816(6),(bool)in_R8B);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,2ul>
            (&local_318,&anon_var_dwarf_3b0458,true);
  sVar3 = local_318.super_Array<char32_t>.size_;
  pcVar1 = local_318.super_Array<char32_t>.ptr;
  if (local_318.super_Array<char32_t>.ptr != (char32_t *)0x0) {
    local_318.super_Array<char32_t>.ptr = (char32_t *)0x0;
    local_318.super_Array<char32_t>.size_ = 0;
    (**(local_318.super_Array<char32_t>.disposer)->_vptr_ArrayDisposer)
              (local_318.super_Array<char32_t>.disposer,pcVar1,4,sVar3,sVar3,0);
    in_R8B = (undefined1)sVar3;
  }
  encodeUtf32(&local_338,(kj *)anon_var_dwarf_3b02ff,(ArrayPtr<const_char>)ZEXT816(7),(bool)in_R8B);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,2ul>
            (&local_338,&anon_var_dwarf_3b0458,true);
  sVar3 = local_338.super_Array<char32_t>.size_;
  pcVar1 = local_338.super_Array<char32_t>.ptr;
  if (local_338.super_Array<char32_t>.ptr != (char32_t *)0x0) {
    local_338.super_Array<char32_t>.ptr = (char32_t *)0x0;
    local_338.super_Array<char32_t>.size_ = 0;
    (**(local_338.super_Array<char32_t>.disposer)->_vptr_ArrayDisposer)
              (local_338.super_Array<char32_t>.disposer,pcVar1,4,sVar3,sVar3,0);
    in_R8B = (undefined1)sVar3;
  }
  encodeUtf32(&local_358,(kj *)anon_var_dwarf_3b0318,(ArrayPtr<const_char>)ZEXT816(8),(bool)in_R8B);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,2ul>
            (&local_358,&anon_var_dwarf_3b0458,true);
  sVar3 = local_358.super_Array<char32_t>.size_;
  pcVar1 = local_358.super_Array<char32_t>.ptr;
  if (local_358.super_Array<char32_t>.ptr != (char32_t *)0x0) {
    local_358.super_Array<char32_t>.ptr = (char32_t *)0x0;
    local_358.super_Array<char32_t>.size_ = 0;
    (**(local_358.super_Array<char32_t>.disposer)->_vptr_ArrayDisposer)
              (local_358.super_Array<char32_t>.disposer,pcVar1,4,sVar3,sVar3,0);
  }
  return;
}

Assistant:

TEST(AsyncUnixTest, SignalWithValue) {
  // This tests that if we use sigqueue() to attach a value to the signal, that value is received
  // correctly.  Note that this only works on platforms that support real-time signals -- even
  // though the signal we're sending is SIGURG, the sigqueue() system call is introduced by RT
  // signals.  Hence this test won't run on e.g. Mac OSX.
  //
  // Also, Android's bionic does not appear to support sigqueue() even though the kernel does.
  //
  // Also, this test fails on Linux on mipsel. si_value comes back as zero. No one with a mips
  // machine wants to debug the problem but they demand a patch fixing it, so we disable the test.
  // Sad. https://github.com/capnproto/capnproto/issues/204

  if (BROKEN_QEMU) return;

  captureSignals();
  UnixEventPort port;
  EventLoop loop(port);
  WaitScope waitScope(loop);

  union sigval value;
  memset(&value, 0, sizeof(value));
  value.sival_int = 123;
  KJ_SYSCALL_HANDLE_ERRORS(sigqueue(getpid(), SIGURG, value)) {
    case ENOSYS:
      // sigqueue() not supported. Maybe running on WSL.
      KJ_LOG(WARNING, "sigqueue() is not implemented by your system; skipping test");
      return;
    default:
      KJ_FAIL_SYSCALL("sigqueue(getpid(), SIGURG, value)", error);
  }

  siginfo_t info = port.onSignal(SIGURG).wait(waitScope);
  EXPECT_EQ(SIGURG, info.si_signo);
  EXPECT_SI_CODE(SI_QUEUE, info.si_code);
  EXPECT_EQ(123, info.si_value.sival_int);
}